

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void constructAutomaticIndex
               (Parse *pParse,WhereClause *pWC,SrcList_item *pSrc,Bitmask notReady,
               WhereLevel *pLevel)

{
  byte *pbVar1;
  undefined1 *puVar2;
  long lVar3;
  byte bVar4;
  u8 uVar5;
  short sVar6;
  int iVar7;
  Vdbe *p;
  Table *pTVar8;
  WhereLoop *p_00;
  sqlite3 *db;
  SrcList *pSVar9;
  int *piVar10;
  bool bVar11;
  byte bVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  Expr *pEVar18;
  Index *pIdx;
  CollSeq *pCVar19;
  uint uVar20;
  WhereTerm *pWVar21;
  char *pcVar22;
  Op *pOVar23;
  WhereTerm *pWVar24;
  uint uVar25;
  ulong uVar26;
  int iVar27;
  ulong uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar32;
  ulong uVar31;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar37;
  ulong uVar36;
  uint uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  uint uVar43;
  uint uVar45;
  uint uVar46;
  undefined1 auVar44 [16];
  uint uVar47;
  undefined1 auVar48 [16];
  ulong uVar49;
  ulong uVar50;
  long local_c0;
  Expr *local_b8;
  char *zNotUsed;
  code *local_58;
  code *local_50;
  u8 local_3c;
  anon_union_8_14_c5524298_for_u local_38;
  
  p = pParse->pVdbe;
  iVar13 = sqlite3VdbeAddOp3(p,0x11,0,0,0);
  pTVar8 = pSrc->pTab;
  pWVar24 = pWC->a;
  pWVar21 = pWVar24 + pWC->nTerm;
  p_00 = pLevel->pWLoop;
  if ((long)pWC->nTerm < 1) {
    uVar30 = 0;
    uVar26 = 0xffffffffffffffff;
    local_b8 = (Expr *)0x0;
  }
  else {
    uVar30 = 0;
    uVar26 = 0;
    bVar11 = false;
    local_b8 = (Expr *)0x0;
    do {
      if (((p_00->prereq == 0) && ((pWVar24->wtFlags & 2) == 0)) &&
         (pEVar18 = pWVar24->pExpr, (pEVar18->flags & 1) == 0)) {
        local_38.n = pSrc->iCursor;
        local_3c = '\x03';
        local_58 = exprNodeIsConstant;
        local_50 = sqlite3SelectWalkFail;
        walkExpr((Walker *)&zNotUsed,pEVar18);
        if (local_3c != '\0') {
          db = pParse->db;
          pEVar18 = exprDup(db,pEVar18,0,(u8 **)0x0);
          local_b8 = sqlite3ExprAnd(db,local_b8,pEVar18);
        }
      }
      iVar14 = termCanDriveIndex(pWVar24,pSrc,notReady);
      if (iVar14 != 0) {
        iVar14 = (pWVar24->u).leftColumn;
        uVar28 = 1L << ((byte)iVar14 & 0x3f);
        if (0x3f < (long)iVar14) {
          uVar28 = 0x8000000000000000;
        }
        if (!bVar11) {
          sqlite3_log(0x11c,"automatic index on %s(%s)",pTVar8->zName,pTVar8->aCol[iVar14].zName);
        }
        bVar11 = true;
        if ((uVar28 & uVar26) == 0) {
          iVar14 = whereLoopResize(pParse->db,p_00,uVar30 + 1);
          if (iVar14 != 0) goto LAB_00189cec;
          p_00->aLTerm[(int)uVar30] = pWVar24;
          uVar26 = uVar26 | uVar28;
          bVar11 = true;
          uVar30 = uVar30 + 1;
        }
      }
      pWVar24 = pWVar24 + 1;
    } while (pWVar24 < pWVar21);
    uVar26 = ~uVar26 | 0x8000000000000000;
  }
  p_00->nLTerm = (u16)uVar30;
  (p_00->u).btree.nEq = (u16)uVar30;
  p_00->wsFlags = 0x4241;
  uVar26 = uVar26 & pSrc->colUsed;
  sVar6 = pTVar8->nCol;
  uVar25 = (uint)sVar6;
  uVar20 = 0x3f;
  if (sVar6 < 0x3f) {
    uVar20 = uVar25;
  }
  if (0 < (int)uVar25) {
    uVar28 = (ulong)(uVar20 + 3 & 0x7c);
    lVar3 = (ulong)uVar20 - 1;
    auVar39._8_4_ = (int)lVar3;
    auVar39._0_8_ = lVar3;
    auVar39._12_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar42._8_4_ = (int)uVar26;
    auVar42._0_8_ = uVar26;
    auVar42._12_4_ = (int)(uVar26 >> 0x20);
    auVar44 = _DAT_001a4ca0;
    auVar48 = _DAT_001a4cb0;
    uVar33 = 0;
    uVar35 = 0;
    uVar38 = 0;
    do {
      uVar37 = uVar38;
      uVar34 = uVar35;
      uVar32 = uVar33;
      uVar29 = uVar30;
      auVar40 = auVar48;
      auVar41 = auVar44;
      uVar49 = 1L << auVar41._0_8_ & uVar26;
      uVar50 = 1L << auVar41._8_8_ & auVar42._8_8_;
      uVar31 = 1L << auVar40._0_8_ & uVar26;
      uVar36 = 1L << auVar40._8_8_ & auVar42._8_8_;
      uVar30 = (uVar29 - ((int)(uVar31 >> 0x20) == 0 && (int)uVar31 == 0)) + 1;
      uVar33 = (uVar32 - ((int)uVar36 == 0 && (int)(uVar36 >> 0x20) == 0)) + 1;
      uVar35 = (uVar34 - ((int)(uVar49 >> 0x20) == 0 && (int)uVar49 == 0)) + 1;
      uVar38 = (uVar37 - ((int)uVar50 == 0 && (int)(uVar50 >> 0x20) == 0)) + 1;
      auVar48._0_8_ = auVar40._0_8_ + 4;
      auVar48._8_8_ = auVar40._8_8_ + 4;
      auVar44._0_8_ = auVar41._0_8_ + 4;
      auVar44._8_8_ = auVar41._8_8_ + 4;
      uVar28 = uVar28 - 4;
    } while (uVar28 != 0);
    auVar39 = auVar39 ^ _DAT_001a4c40;
    auVar40 = auVar40 ^ _DAT_001a4c40;
    iVar14 = auVar39._4_4_;
    iVar15 = auVar39._12_4_;
    auVar41 = auVar41 ^ _DAT_001a4c40;
    uVar43 = -(uint)(iVar14 < auVar40._4_4_ ||
                    auVar40._4_4_ == iVar14 && auVar39._0_4_ < auVar40._0_4_);
    uVar45 = -(uint)(iVar15 < auVar40._12_4_ ||
                    auVar40._12_4_ == iVar15 && auVar39._8_4_ < auVar40._8_4_);
    uVar46 = -(uint)(iVar14 < auVar41._4_4_ ||
                    auVar41._4_4_ == iVar14 && auVar39._0_4_ < auVar41._0_4_);
    uVar47 = -(uint)(iVar15 < auVar41._12_4_ ||
                    auVar41._12_4_ == iVar15 && auVar39._8_4_ < auVar41._8_4_);
    uVar30 = (~uVar47 & uVar38 | uVar37 & uVar47) + (~uVar45 & uVar33 | uVar32 & uVar45) +
             (~uVar46 & uVar35 | uVar34 & uVar46) + (~uVar43 & uVar30 | uVar29 & uVar43);
  }
  iVar14 = 1;
  if ((long)pSrc->colUsed < 0) {
    iVar14 = uVar25 - 0x3e;
  }
  uVar28 = 0;
  pIdx = sqlite3AllocateIndexObject(pParse->db,(i16)(iVar14 + uVar30),0,&zNotUsed);
  if (pIdx != (Index *)0x0) {
    (p_00->u).btree.pIndex = pIdx;
    pIdx->zName = "auto-index";
    pIdx->pTable = pTVar8;
    pWVar24 = pWC->a;
    if (pWVar24 < pWVar21) {
      uVar28 = 0;
      uVar31 = 0;
      do {
        iVar15 = termCanDriveIndex(pWVar24,pSrc,notReady);
        if (iVar15 != 0) {
          iVar15 = (pWVar24->u).leftColumn;
          uVar36 = 1L << ((byte)iVar15 & 0x3f);
          if (0x3f < iVar15) {
            uVar36 = 0x8000000000000000;
          }
          if ((uVar36 & uVar31) == 0) {
            pEVar18 = pWVar24->pExpr;
            iVar17 = (int)uVar28;
            pIdx->aiColumn[iVar17] = (i16)iVar15;
            pCVar19 = sqlite3BinaryCompareCollSeq(pParse,pEVar18->pLeft,pEVar18->pRight);
            pcVar22 = "BINARY";
            if (pCVar19 != (CollSeq *)0x0) {
              pcVar22 = pCVar19->zName;
            }
            uVar31 = uVar31 | uVar36;
            pIdx->azColl[iVar17] = pcVar22;
            uVar28 = (ulong)(iVar17 + 1);
          }
        }
        pWVar24 = pWVar24 + 1;
      } while (pWVar24 < pWVar21);
    }
    if (0 < sVar6) {
      uVar31 = 0;
      do {
        if ((uVar26 >> (uVar31 & 0x3f) & 1) != 0) {
          iVar15 = (int)uVar28;
          pIdx->aiColumn[iVar15] = (i16)uVar31;
          pIdx->azColl[iVar15] = "BINARY";
          uVar28 = (ulong)(iVar15 + 1);
        }
        uVar31 = uVar31 + 1;
      } while (uVar20 != uVar31);
    }
    if (((long)pSrc->colUsed < 0) && (0x3f < pTVar8->nCol)) {
      uVar28 = (ulong)(int)uVar28;
      iVar15 = 0x3f;
      do {
        pIdx->aiColumn[uVar28] = (i16)iVar15;
        pIdx->azColl[uVar28] = "BINARY";
        uVar28 = uVar28 + 1;
        iVar15 = iVar15 + 1;
      } while (iVar15 < pTVar8->nCol);
    }
    iVar27 = (int)uVar28;
    pIdx->aiColumn[iVar27] = -1;
    pIdx->azColl[iVar27] = "BINARY";
    iVar15 = pParse->nTab;
    pParse->nTab = iVar15 + 1;
    pLevel->iIdxCur = iVar15;
    iVar17 = 0;
    sqlite3VdbeAddOp3(p,0x70,iVar15,iVar14 + uVar30,0);
    sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
    pSVar9 = pWC->pWInfo->pTabList;
    bVar4 = pLevel->iFrom;
    if ((pSVar9->a[bVar4].fg.field_0x1 & 0x10) == 0) {
      iVar14 = pLevel->iTabCur;
      iVar15 = 0x24;
    }
    else {
      iVar14 = pSVar9->a[bVar4].regReturn;
      iVar17 = sqlite3VdbeAddOp3(p,0x46,0,0,0);
      sqlite3VdbeAddOp3(p,0xd,iVar14,0,pSVar9->a[bVar4].addrFillSub);
      iVar15 = 0xe;
    }
    iVar14 = sqlite3VdbeAddOp3(p,iVar15,iVar14,0,0);
    if (local_b8 == (Expr *)0x0) {
      local_c0 = -1;
    }
    else {
      uVar30 = sqlite3VdbeMakeLabel((Vdbe *)p->pParse);
      sqlite3ExprIfFalse(pParse,local_b8,uVar30,0x10);
      pbVar1 = (byte *)((long)&p_00->wsFlags + 2);
      *pbVar1 = *pbVar1 | 2;
      local_c0 = (long)(int)~uVar30;
    }
    if (pParse->nTempReg == '\0') {
      iVar15 = pParse->nMem + 1;
      pParse->nMem = iVar15;
    }
    else {
      bVar12 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar12;
      iVar15 = pParse->aTempReg[bVar12];
    }
    iVar16 = sqlite3GenerateIndexKey(pParse,pIdx,pLevel->iTabCur,iVar15,0,(int *)0x0,(Index *)0x0,0)
    ;
    sqlite3VdbeAddOp3(p,0x85,pLevel->iIdxCur,iVar15,0);
    iVar7 = p->nOp;
    if (0 < (long)iVar7) {
      p->aOp[(long)iVar7 + -1].p5 = 0x10;
    }
    if ((local_b8 != (Expr *)0x0) && (piVar10 = p->pParse->aLabel, piVar10 != (int *)0x0)) {
      piVar10[local_c0] = iVar7;
    }
    if ((pSVar9->a[bVar4].fg.field_0x1 & 0x10) == 0) {
      sqlite3VdbeAddOp3(p,5,pLevel->iTabCur,iVar14 + 1,0);
    }
    else {
      if (iVar17 < 0) {
        iVar17 = p->nOp + -1;
      }
      if (p->db->mallocFailed == '\0') {
        pOVar23 = p->aOp + iVar17;
      }
      else {
        pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar23->p2 = iVar16 + iVar27;
      translateColumnToCopy(pParse,iVar14,pLevel->iTabCur,pSVar9->a[bVar4].regResult,1);
      sqlite3VdbeAddOp3(p,0xb,0,iVar14,0);
      puVar2 = &pSVar9->a[bVar4].fg.field_0x1;
      *puVar2 = *puVar2 & 0xef;
    }
    iVar17 = p->nOp;
    if (0 < (long)iVar17) {
      p->aOp[(long)iVar17 + -1].p5 = 3;
    }
    uVar5 = p->db->mallocFailed;
    if (uVar5 == '\0') {
      iVar27 = iVar17 + -1;
      if (-1 < iVar14) {
        iVar27 = iVar14;
      }
      pOVar23 = p->aOp + iVar27;
    }
    else {
      pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar23->p2 = iVar17;
    if (iVar15 != 0) {
      bVar4 = pParse->nTempReg;
      if ((ulong)bVar4 < 8) {
        pParse->nTempReg = bVar4 + 1;
        pParse->aTempReg[bVar4] = iVar15;
        iVar17 = p->nOp;
      }
    }
    if (uVar5 == '\0') {
      iVar14 = iVar17 + -1;
      if (-1 < iVar13) {
        iVar14 = iVar13;
      }
      pOVar23 = p->aOp + iVar14;
    }
    else {
      pOVar23 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar23->p2 = iVar17;
  }
LAB_00189cec:
  if (local_b8 != (Expr *)0x0) {
    sqlite3ExprDeleteNN(pParse->db,local_b8);
  }
  return;
}

Assistant:

static void constructAutomaticIndex(
  Parse *pParse,              /* The parsing context */
  WhereClause *pWC,           /* The WHERE clause */
  struct SrcList_item *pSrc,  /* The FROM clause term to get the next index */
  Bitmask notReady,           /* Mask of cursors that are not available */
  WhereLevel *pLevel          /* Write new index here */
){
  int nKeyCol;                /* Number of columns in the constructed index */
  WhereTerm *pTerm;           /* A single term of the WHERE clause */
  WhereTerm *pWCEnd;          /* End of pWC->a[] */
  Index *pIdx;                /* Object describing the transient index */
  Vdbe *v;                    /* Prepared statement under construction */
  int addrInit;               /* Address of the initialization bypass jump */
  Table *pTable;              /* The table being indexed */
  int addrTop;                /* Top of the index fill loop */
  int regRecord;              /* Register holding an index record */
  int n;                      /* Column counter */
  int i;                      /* Loop counter */
  int mxBitCol;               /* Maximum column in pSrc->colUsed */
  CollSeq *pColl;             /* Collating sequence to on a column */
  WhereLoop *pLoop;           /* The Loop object */
  char *zNotUsed;             /* Extra space on the end of pIdx */
  Bitmask idxCols;            /* Bitmap of columns used for indexing */
  Bitmask extraCols;          /* Bitmap of additional columns */
  u8 sentWarning = 0;         /* True if a warnning has been issued */
  Expr *pPartial = 0;         /* Partial Index Expression */
  int iContinue = 0;          /* Jump here to skip excluded rows */
  struct SrcList_item *pTabItem;  /* FROM clause term being indexed */
  int addrCounter = 0;        /* Address where integer counter is initialized */
  int regBase;                /* Array of registers where record is assembled */

  /* Generate code to skip over the creation and initialization of the
  ** transient index on 2nd and subsequent iterations of the loop. */
  v = pParse->pVdbe;
  assert( v!=0 );
  addrInit = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);

  /* Count the number of columns that will be added to the index
  ** and used to match WHERE clause constraints */
  nKeyCol = 0;
  pTable = pSrc->pTab;
  pWCEnd = &pWC->a[pWC->nTerm];
  pLoop = pLevel->pWLoop;
  idxCols = 0;
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    Expr *pExpr = pTerm->pExpr;
    assert( !ExprHasProperty(pExpr, EP_FromJoin)    /* prereq always non-zero */
         || pExpr->iRightJoinTable!=pSrc->iCursor   /*   for the right-hand   */
         || pLoop->prereq!=0 );                     /*   table of a LEFT JOIN */
    if( pLoop->prereq==0
     && (pTerm->wtFlags & TERM_VIRTUAL)==0
     && !ExprHasProperty(pExpr, EP_FromJoin)
     && sqlite3ExprIsTableConstant(pExpr, pSrc->iCursor) ){
      pPartial = sqlite3ExprAnd(pParse->db, pPartial,
                                sqlite3ExprDup(pParse->db, pExpr, 0));
    }
    if( termCanDriveIndex(pTerm, pSrc, notReady) ){
      int iCol = pTerm->u.leftColumn;
      Bitmask cMask = iCol>=BMS ? MASKBIT(BMS-1) : MASKBIT(iCol);
      testcase( iCol==BMS );
      testcase( iCol==BMS-1 );
      if( !sentWarning ){
        sqlite3_log(SQLITE_WARNING_AUTOINDEX,
            "automatic index on %s(%s)", pTable->zName,
            pTable->aCol[iCol].zName);
        sentWarning = 1;
      }
      if( (idxCols & cMask)==0 ){
        if( whereLoopResize(pParse->db, pLoop, nKeyCol+1) ){
          goto end_auto_index_create;
        }
        pLoop->aLTerm[nKeyCol++] = pTerm;
        idxCols |= cMask;
      }
    }
  }
  assert( nKeyCol>0 );
  pLoop->u.btree.nEq = pLoop->nLTerm = nKeyCol;
  pLoop->wsFlags = WHERE_COLUMN_EQ | WHERE_IDX_ONLY | WHERE_INDEXED
                     | WHERE_AUTO_INDEX;

  /* Count the number of additional columns needed to create a
  ** covering index.  A "covering index" is an index that contains all
  ** columns that are needed by the query.  With a covering index, the
  ** original table never needs to be accessed.  Automatic indices must
  ** be a covering index because the index will not be updated if the
  ** original table changes and the index and table cannot both be used
  ** if they go out of sync.
  */
  extraCols = pSrc->colUsed & (~idxCols | MASKBIT(BMS-1));
  mxBitCol = MIN(BMS-1,pTable->nCol);
  testcase( pTable->nCol==BMS-1 );
  testcase( pTable->nCol==BMS-2 );
  for(i=0; i<mxBitCol; i++){
    if( extraCols & MASKBIT(i) ) nKeyCol++;
  }
  if( pSrc->colUsed & MASKBIT(BMS-1) ){
    nKeyCol += pTable->nCol - BMS + 1;
  }

  /* Construct the Index object to describe this index */
  pIdx = sqlite3AllocateIndexObject(pParse->db, nKeyCol+1, 0, &zNotUsed);
  if( pIdx==0 ) goto end_auto_index_create;
  pLoop->u.btree.pIndex = pIdx;
  pIdx->zName = "auto-index";
  pIdx->pTable = pTable;
  n = 0;
  idxCols = 0;
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    if( termCanDriveIndex(pTerm, pSrc, notReady) ){
      int iCol = pTerm->u.leftColumn;
      Bitmask cMask = iCol>=BMS ? MASKBIT(BMS-1) : MASKBIT(iCol);
      testcase( iCol==BMS-1 );
      testcase( iCol==BMS );
      if( (idxCols & cMask)==0 ){
        Expr *pX = pTerm->pExpr;
        idxCols |= cMask;
        pIdx->aiColumn[n] = pTerm->u.leftColumn;
        pColl = sqlite3BinaryCompareCollSeq(pParse, pX->pLeft, pX->pRight);
        pIdx->azColl[n] = pColl ? pColl->zName : sqlite3StrBINARY;
        n++;
      }
    }
  }
  assert( (u32)n==pLoop->u.btree.nEq );

  /* Add additional columns needed to make the automatic index into
  ** a covering index */
  for(i=0; i<mxBitCol; i++){
    if( extraCols & MASKBIT(i) ){
      pIdx->aiColumn[n] = i;
      pIdx->azColl[n] = sqlite3StrBINARY;
      n++;
    }
  }
  if( pSrc->colUsed & MASKBIT(BMS-1) ){
    for(i=BMS-1; i<pTable->nCol; i++){
      pIdx->aiColumn[n] = i;
      pIdx->azColl[n] = sqlite3StrBINARY;
      n++;
    }
  }
  assert( n==nKeyCol );
  pIdx->aiColumn[n] = XN_ROWID;
  pIdx->azColl[n] = sqlite3StrBINARY;

  /* Create the automatic index */
  assert( pLevel->iIdxCur>=0 );
  pLevel->iIdxCur = pParse->nTab++;
  sqlite3VdbeAddOp2(v, OP_OpenAutoindex, pLevel->iIdxCur, nKeyCol+1);
  sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
  VdbeComment((v, "for %s", pTable->zName));

  /* Fill the automatic index with content */
  pTabItem = &pWC->pWInfo->pTabList->a[pLevel->iFrom];
  if( pTabItem->fg.viaCoroutine ){
    int regYield = pTabItem->regReturn;
    addrCounter = sqlite3VdbeAddOp2(v, OP_Integer, 0, 0);
    sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, pTabItem->addrFillSub);
    addrTop =  sqlite3VdbeAddOp1(v, OP_Yield, regYield);
    VdbeCoverage(v);
    VdbeComment((v, "next row of %s", pTabItem->pTab->zName));
  }else{
    addrTop = sqlite3VdbeAddOp1(v, OP_Rewind, pLevel->iTabCur); VdbeCoverage(v);
  }
  if( pPartial ){
    iContinue = sqlite3VdbeMakeLabel(v);
    sqlite3ExprIfFalse(pParse, pPartial, iContinue, SQLITE_JUMPIFNULL);
    pLoop->wsFlags |= WHERE_PARTIALIDX;
  }
  regRecord = sqlite3GetTempReg(pParse);
  regBase = sqlite3GenerateIndexKey(
      pParse, pIdx, pLevel->iTabCur, regRecord, 0, 0, 0, 0
  );
  sqlite3VdbeAddOp2(v, OP_IdxInsert, pLevel->iIdxCur, regRecord);
  sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
  if( pPartial ) sqlite3VdbeResolveLabel(v, iContinue);
  if( pTabItem->fg.viaCoroutine ){
    sqlite3VdbeChangeP2(v, addrCounter, regBase+n);
    testcase( pParse->db->mallocFailed );
    translateColumnToCopy(pParse, addrTop, pLevel->iTabCur,
                          pTabItem->regResult, 1);
    sqlite3VdbeGoto(v, addrTop);
    pTabItem->fg.viaCoroutine = 0;
  }else{
    sqlite3VdbeAddOp2(v, OP_Next, pLevel->iTabCur, addrTop+1); VdbeCoverage(v);
  }
  sqlite3VdbeChangeP5(v, SQLITE_STMTSTATUS_AUTOINDEX);
  sqlite3VdbeJumpHere(v, addrTop);
  sqlite3ReleaseTempReg(pParse, regRecord);
  
  /* Jump here when skipping the initialization */
  sqlite3VdbeJumpHere(v, addrInit);

end_auto_index_create:
  sqlite3ExprDelete(pParse->db, pPartial);
}